

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_iarchive_impl.cpp
# Opt level: O2

void __thiscall
boost::archive::json_iarchive_impl::load_override(json_iarchive_impl *this,object_reference_type *t)

{
  Json *this_00;
  reference expr;
  reference_type puVar1;
  size_t local_28;
  object_reference_type local_1c;
  
  this_00 = json_archive::get_data_abi_cxx11_(&(this->super_json_archive_interface).archive_);
  expr = nlohmann::
         basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
         ::operator[](this_00,(key_type *)param::ObjectReferenceType_abi_cxx11_);
  if ((byte)(expr->m_type - number_integer) < 3) {
    optional<unsigned_int>::operator=(&(this->super_json_archive_interface).object_id_,expr);
    (this->super_json_archive_interface).object_id_type_ = Reference;
    puVar1 = optional<unsigned_int>::get(&(this->super_json_archive_interface).class_id_);
    local_28 = (size_t)(int)*puVar1;
    object_id_type::object_id_type(&local_1c.super_object_id_type,&local_28);
    (t->super_object_id_type).t = (base_type)local_1c;
  }
  return;
}

Assistant:

void json_iarchive_impl::load_override(object_reference_type& t)
{
    Json& data = archive_.get_data()[param::ObjectReferenceType];
    if(!data.is_number())
    {
        return;
    }

    object_id_ = data;
    object_id_type_ = ObjectIDType::Reference;
    t = object_reference_type(object_id_type(int(*class_id_)));
}